

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void __thiscall ot::commissioner::JsonException::~JsonException(JsonException *this)

{
  *(undefined ***)this = &PTR__JsonException_002895d8;
  std::__cxx11::string::~string((string *)&(this->mError).mMessage);
  std::invalid_argument::~invalid_argument(&this->super_invalid_argument);
  return;
}

Assistant:

explicit JsonException(Error aError)
        : std::invalid_argument(aError.GetMessage())
        , mError(aError)
    {
    }